

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_dec.cpp
# Opt level: O1

MPP_RET mpp_dec_set_cfg_by_cmd(MppDecCfgSet *set,MpiCmd cmd,void *param)

{
  byte *pbVar1;
  MppFrameFormat MVar2;
  char *fmt;
  RK_U32 RVar3;
  
  switch(cmd) {
  case MPP_DEC_SET_PRESENT_TIME_ORDER:
    if (param == (void *)0x0) {
      RVar3 = 1;
    }
    else {
      RVar3 = *param;
    }
    (set->base).sort_pts = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 0x20;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "sort time order %d\n";
    break;
  case MPP_DEC_SET_PARSER_SPLIT_MODE:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).split_parse = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 8;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "split parse mode %d\n";
    break;
  case MPP_DEC_SET_PARSER_FAST_MODE:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).fast_parse = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 4;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "fast parse mode %d\n";
    break;
  default:
    _mpp_log_l(2,"mpp_dec","unsupported cfg update cmd %x\n","mpp_dec_set_cfg_by_cmd");
    return MPP_NOK;
  case MPP_DEC_SET_OUTPUT_FORMAT:
    MVar2 = MPP_FMT_YUV420SP;
    if (param != (void *)0x0) {
      MVar2 = *param;
    }
    (set->base).out_fmt = MVar2;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 1;
    return MPP_OK;
  case MPP_DEC_SET_DISABLE_ERROR:
    if (param == (void *)0x0) {
      RVar3 = 1;
    }
    else {
      RVar3 = *param;
    }
    (set->base).disable_error = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 0x40;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "disable error %d\n";
    break;
  case MPP_DEC_SET_IMMEDIATE_OUT:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).fast_out = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 2;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "fast output mode %d\n";
    break;
  case MPP_DEC_SET_ENABLE_DEINTERLACE:
    if (param == (void *)0x0) {
      RVar3 = 1;
    }
    else {
      RVar3 = *param;
    }
    (set->base).enable_vproc = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 1);
    *pbVar1 = *pbVar1 | 0x80;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "enable dec_vproc %x\n";
    break;
  case MPP_DEC_SET_ENABLE_FAST_PLAY:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).enable_fast_play = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 2);
    *pbVar1 = *pbVar1 | 1;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "disable idr immediately output %d\n";
    break;
  case MPP_DEC_SET_ENABLE_MVC:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).enable_mvc = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 2);
    *pbVar1 = *pbVar1 | 8;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "enable MVC decoder %d\n";
    break;
  case MPP_DEC_SET_DISABLE_DPB_CHECK:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).disable_dpb_chk = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 2);
    *pbVar1 = *pbVar1 | 0x10;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "disable dpb discontinuous check %d\n";
    break;
  case MPP_DEC_SET_CODEC_MODE:
    RVar3 = 0;
    if (param != (void *)0x0) {
      RVar3 = *param;
    }
    (set->base).codec_mode = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 3);
    *pbVar1 = *pbVar1 | 0x20;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "force use codec device %d\n";
    break;
  case MPP_DEC_SET_DIS_ERR_CLR_MARK:
    if (param == (void *)0x0) {
      RVar3 = 1;
    }
    else {
      RVar3 = *param;
    }
    (set->base).dis_err_clr_mark = RVar3;
    pbVar1 = (byte *)((long)&(set->base).change + 3);
    *pbVar1 = *pbVar1 | 0x40;
    if (((byte)mpp_dec_debug & 1) == 0) {
      return MPP_OK;
    }
    fmt = "disable error not mark%d\n";
  }
  _mpp_log_l(4,"mpp_dec",fmt,"mpp_dec_set_cfg_by_cmd");
  return MPP_OK;
}

Assistant:

MPP_RET mpp_dec_set_cfg_by_cmd(MppDecCfgSet *set, MpiCmd cmd, void *param)
{
    MppDecBaseCfg *cfg = &set->base;
    MPP_RET ret = MPP_OK;

    switch (cmd) {
    case MPP_DEC_SET_PRESENT_TIME_ORDER : {
        cfg->sort_pts = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_SORT_PTS;
        dec_dbg_func("sort time order %d\n", cfg->sort_pts);
    } break;
    case MPP_DEC_SET_PARSER_SPLIT_MODE : {
        cfg->split_parse = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_SPLIT_PARSE;
        dec_dbg_func("split parse mode %d\n", cfg->split_parse);
    } break;
    case MPP_DEC_SET_PARSER_FAST_MODE : {
        cfg->fast_parse = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_FAST_PARSE;
        dec_dbg_func("fast parse mode %d\n", cfg->fast_parse);
    } break;
    case MPP_DEC_SET_OUTPUT_FORMAT : {
        cfg->out_fmt = (param) ? (*((MppFrameFormat *)param)) : (MPP_FMT_YUV420SP);
        cfg->change |= MPP_DEC_CFG_CHANGE_OUTPUT_FORMAT;
    } break;
    case MPP_DEC_SET_DISABLE_ERROR: {
        cfg->disable_error = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_DISABLE_ERROR;
        dec_dbg_func("disable error %d\n", cfg->disable_error);
    } break;
    case MPP_DEC_SET_DIS_ERR_CLR_MARK: {
        cfg->dis_err_clr_mark = (param) ? (*((RK_U32 *)param)) : (1);
        cfg->change |= MPP_DEC_CFG_CHANGE_DIS_ERR_CLR_MARK;
        dec_dbg_func("disable error not mark%d\n", cfg->dis_err_clr_mark);
    } break;
    case MPP_DEC_SET_IMMEDIATE_OUT : {
        cfg->fast_out = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_FAST_OUT;
        dec_dbg_func("fast output mode %d\n", cfg->fast_out);
    } break;
    case MPP_DEC_SET_ENABLE_DEINTERLACE: {
        cfg->enable_vproc = (param) ? (*((RK_U32 *)param)) : MPP_VPROC_MODE_DEINTELACE;
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_VPROC;
        dec_dbg_func("enable dec_vproc %x\n", cfg->enable_vproc);
    } break;
    case MPP_DEC_SET_ENABLE_FAST_PLAY : {
        cfg->enable_fast_play = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_FAST_PLAY;
        dec_dbg_func("disable idr immediately output %d\n", cfg->enable_fast_play);
    } break;
    case MPP_DEC_SET_ENABLE_MVC : {
        cfg->enable_mvc = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_ENABLE_MVC;
        dec_dbg_func("enable MVC decoder %d\n", cfg->enable_mvc);
    } break;
    case MPP_DEC_SET_DISABLE_DPB_CHECK : {
        cfg->disable_dpb_chk = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_DISABLE_DPB_CHECK;
        dec_dbg_func("disable dpb discontinuous check %d\n", cfg->disable_dpb_chk);
    } break;
    case MPP_DEC_SET_CODEC_MODE : {
        cfg->codec_mode = (param) ? (*((RK_U32 *)param)) : (0);
        cfg->change |= MPP_DEC_CFG_CHANGE_CODEC_MODE;
        dec_dbg_func("force use codec device %d\n", cfg->codec_mode);
    } break;
    default : {
        mpp_err_f("unsupported cfg update cmd %x\n", cmd);
        ret = MPP_NOK;
    } break;
    }

    return ret;
}